

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O2

int mainProbeProc(int argc,char **argv,FILE *outf)

{
  uint uVar1;
  residue_t *prVar2;
  byte bVar3;
  char cVar4;
  atom_t *theAtoms;
  pattern *ppVar5;
  pattern *ignorePat;
  xformDatabase *xdb;
  FILE *pFVar6;
  char *pcVar7;
  undefined4 in_register_0000003c;
  char *pcVar8;
  int countDots_00;
  atomBins *bins;
  int rawOutput_00;
  char *reslstptr;
  float probeRad;
  float local_9a4;
  int rawOutput;
  int countDots;
  int drawSpike;
  float spikelen;
  float density;
  int keepUnselected;
  int sayGroup;
  int method;
  FILE *local_980;
  pattern *local_978;
  atomBins *local_970;
  pattern *local_968;
  int conFlag;
  int addKinToFile;
  char **local_958;
  undefined8 local_950;
  residue *resLst;
  char *groupLabel;
  char *srcArg;
  pattern *local_930;
  atom *local_928;
  char *ignoreArg;
  char *extraArg;
  char *targArg;
  movingCommandInfo mcis;
  movingAtomBuildInfo mabis;
  char message [200];
  region local_788;
  pointSet dots [114];
  
  local_950 = CONCAT44(in_register_0000003c,argc);
  srcArg = (char *)0x0;
  targArg = (char *)0x0;
  extraArg = (char *)0x0;
  ignoreArg = (char *)0x0;
  groupLabel = (char *)0x0;
  reslstptr = (char *)&resLst;
  resLst = (residue *)0x0;
  local_980 = (FILE *)outf;
  local_958 = argv;
  theAtoms = processCommandline(argc,argv,&method,&local_788,&density,&probeRad,&drawSpike,&spikelen
                                ,&countDots,&keepUnselected,&srcArg,&targArg,&extraArg,&ignoreArg,
                                &groupLabel,&rawOutput,&conFlag,&sayGroup,&addKinToFile,&mabis,
                                (residue **)reslstptr);
  if (mabis.inf == (FILE *)0x0 && theAtoms == (atom *)0x0) {
    builtin_strncpy(message,"No atom data in input.",0x17);
  }
  else {
    countDots_00 = countDots;
    rawOutput_00 = rawOutput;
    if (Verbose != 1) {
      note(
          "probe: version 2.26.021123, Copyright 1996-2016, J. Michael Word; 2021-2023 Richardson Lab"
          );
      sprintf(message,"density: %g, probe radius: %g, maxBonded: %d",SUB84((double)density,0),
              (double)probeRad,(ulong)(uint)Maxbonded);
      note(message);
      sprintf(message,"regular HB cutoff: %g, charged HB cutoff: %g",
              SUB84((double)Min_regular_hb_cutoff,0),(double)Min_charged_hb_cutoff);
      note(message);
      sprintf(message,"Dot gap bins: low to %g, %g to 0, 0 to %g, %g to high, & Hbonds",
              SUB84((double)LowGoodCut,0),(double)LowGoodCut);
      note(message);
      if (0.0001 < ABS(RadScaleOffset)) {
        sprintf(message,"Add %g to VDW Rradius");
        note(message);
      }
      if ((RadScaleFactor < 0.9999) || (1.0001 < RadScaleFactor)) {
        sprintf(message,"Scale VDW Rradius by %g");
        note(message);
      }
      sprintf(message,"C=O carbon VDW scaled by %.3f to a radius of %g A",
              SUB84((double)CORadScale,0),(double)CORadScale * 1.7);
      note(message);
      countDots_00 = countDots;
      rawOutput_00 = rawOutput;
      if (rawOutput != 0 || countDots != 0) {
        sprintf(message,"Score Weights: gapWt=%g, bumpWt=%g, HBWt=%g",SUB84((double)GAPweight,0),
                (double)BUMPweight,(double)HBweight);
        note(message);
      }
      if (drawSpike != 0) {
        sprintf(message,"draw spike, len: %g",SUB84((double)spikelen,0));
        note(message);
      }
      if (ImplicitH == '\x01') {
        note("implicit hydrogens");
      }
      if (PermitCHXHB == '\x01') {
        sprintf(message,"CH..O type hbonds recognized (scale factor %g)",
                SUB84((double)CHOHBfactor,0));
        note(message);
      }
      if (DoMcMc == '\0') {
        note("Excluding mainchain-mainchain interactions");
      }
      if ((DoHet & DoH2O & 1) == 0) {
        if ((DoHet & 1) == 0) {
          bVar3 = DoH2O & 1;
        }
        else {
          note("Excluding non-water HET groups");
          bVar3 = DoH2O;
        }
        if (bVar3 != 0) {
          pcVar8 = "Excluding waters";
          goto LAB_00126d52;
        }
        if (DoWatWat == '\0') {
          pcVar8 = "Excluding water-water interactions";
          goto LAB_00126d52;
        }
      }
      else {
        pcVar8 = "Excluding both HET groups and waters";
LAB_00126d52:
        note(pcVar8);
      }
      if (LimitDots == '\0') {
        note("Limiting dots from bumps to max non-bump cap");
      }
      if ((rawOutput_00 == 0) && (OutputFmtType - 1U < 3)) {
        note(&DAT_0013d9c0 + *(int *)(&DAT_0013d9c0 + (ulong)(OutputFmtType - 1U) * 4));
      }
      if (ByNABaseColor == '\x01') {
        pcVar8 = "Coloring dots by gap (& list color by nucleic acid base)";
        if ((ColorGap & 1) != 0) {
          pcVar8 = "Coloring dots by nucleic acid base";
        }
LAB_00126dc3:
        note(pcVar8);
      }
      else if ((ColorGap & 1) == 0) {
        pcVar8 = "Coloring dots by gap (& list color by atom)";
        goto LAB_00126dc3;
      }
      if (UsePolarH == '\x01') {
        note("Using old (long) radii for polar H atoms");
      }
      if (OutputHBs == '\x01') {
        note("Attention: ***Output not generated for H-Bond contacts***");
      }
      if (OutputClashes == '\x01') {
        note("Attention: ***Output not generated for clashes***");
      }
      if (OutputVDWs == '\x01') {
        note("Attention: ***Output not generated for van der Waals contacts***");
      }
      if (OnlyBadOut == '\x01') {
        note("Attention: ***Output only generated for Bad Clashes***");
      }
      if (keepUnselected == 0) {
        note("Attention: ***Unselected atoms dropped (ignored)***");
      }
    }
    if (((OutputFmtType == 0 && countDots_00 == 0) && rawOutput_00 == 0) && addKinToFile != 0) {
      fwrite("@kinemage 1\n",0xc,1,local_980);
    }
    pcVar8 = srcArg;
    ppVar5 = getPat(srcArg,"pattern 1",Verbose ^ 1);
    sourcePat = getPat(pcVar8,"pattern 1",Verbose ^ 1);
    local_968 = ppVar5;
    modelSrc = modelInPattern(ppVar5);
    if ((Verbose == 0) && (0 < modelSrc)) {
      sprintf(message,"specified src  model==%d",(ulong)(uint)modelSrc);
      note(message);
    }
    pcVar8 = targArg;
    ppVar5 = getPat(targArg,"pattern 2",(byte)~Verbose & 1);
    causePat = getPat(pcVar8,"pattern 2",Verbose ^ 1);
    modelTarg = modelInPattern(ppVar5);
    if ((Verbose == 0) && (0 < modelSrc)) {
      sprintf(message,"specified targ model==%d",(ulong)(uint)modelTarg);
      note(message);
    }
    extraPat = getPat(extraArg,"extra",(byte)~Verbose & 1);
    ignorePat = getPat(ignoreArg,"ignore",Verbose ^ 1);
    local_9a4 = density;
    loadDotSpheres(dots,density);
    if (theAtoms == (atom *)0x0) {
      local_788.min.x = 0.0;
      local_788.min.y = 0.0;
      local_788.min.z = 0.0;
      local_788.max.z = 0.1;
      local_788.max.x = 0.1;
      local_788.max.y = 0.1;
      local_970 = initBins('a',&local_788,1.0);
    }
    else {
      selectSource(theAtoms,local_968,1,ppVar5,2,ignorePat);
      local_970 = binAtoms(theAtoms,&local_788,'a',probeRad,keepUnselected,3);
    }
    pFVar6 = local_980;
    if (mabis.inf == (FILE *)0x0) {
      if (ImplicitH == '\0') {
        reslstptr = (char *)((ulong)reslstptr & 0xffffffff00000000);
        updateHydrogenInfo((FILE *)local_980,theAtoms,local_970,(atom *)0x0,(atomBins *)0x0,3,0);
      }
      if (dumpFileName != (char *)0x0) {
        local_978 = ignorePat;
        local_930 = ppVar5;
        pFVar6 = fopen(dumpFileName,"wb");
        local_928 = theAtoms;
        for (; theAtoms != (atom *)0x0; theAtoms = theAtoms->next) {
          if (theAtoms->elem != 5) {
            prVar2 = theAtoms->r;
            cVar4 = theAtoms->altConf;
            if (cVar4 == ' ') {
              cVar4 = '-';
            }
            uVar1 = theAtoms->props;
            pcVar8 = "isAcceptor";
            if ((uVar1 >> 0x11 & 1) == 0) {
              pcVar8 = "noAcceptor";
            }
            reslstptr = "isDonor";
            if ((uVar1 >> 0x10 & 1) == 0) {
              reslstptr = "noDonor";
            }
            pcVar7 = "isMetallic";
            if ((uVar1 >> 0xe & 1) == 0) {
              pcVar7 = "noMetallic";
            }
            fprintf(pFVar6,"%s %s %3d %-4s %c %7.3f %7.3f %7.3f %5.2f %s %s %s\n",
                    SUB84((theAtoms->loc).x,0),(theAtoms->loc).y,(theAtoms->loc).z,prVar2->chain,
                    prVar2->resname,(ulong)(uint)prVar2->resid,theAtoms->atomname,
                    (ulong)(uint)(int)cVar4,pcVar8,reslstptr,pcVar7);
          }
        }
        fclose(pFVar6);
        local_9a4 = density;
        theAtoms = local_928;
        ignorePat = local_978;
        ppVar5 = local_930;
        countDots_00 = countDots;
        rawOutput_00 = rawOutput;
      }
      bins = local_970;
      doCommand((FILE *)local_980,method,theAtoms,local_970,(atom *)0x0,(atomBins *)0x0,dots,
                probeRad,local_9a4,spikelen,countDots_00,rawOutput_00,conFlag,"",0.0,drawSpike,
                sayGroup,groupLabel,(int)local_950,local_958,reslstptr);
    }
    else {
      mcis.firstPass = 1;
      mcis.keepUnselected = keepUnselected;
      mcis.outf = (FILE *)local_980;
      mcis.method = method;
      mcis.waterClones = (atom *)0x0;
      mcis.dots = dots;
      mcis.probeRad = probeRad;
      mcis.density = local_9a4;
      mcis.spikelen = spikelen;
      mcis.drawSpike = drawSpike;
      mcis.sayGroup = sayGroup;
      mcis.groupLabel = groupLabel;
      mcis.argc = (int)local_950;
      mcis.argv = local_958;
      mcis.message = message;
      mabis.srcPat = local_968;
      local_978 = ignorePat;
      mcis.allMainAtoms = theAtoms;
      mcis.abins = local_970;
      mabis.targPat = ppVar5;
      descrCommand((FILE *)local_980,"#","#",mcis.argc,local_958);
      xdb = readTransformationDatabase
                      (mabis.inf,(FILE *)pFVar6,newMovingAtom,&mabis,movingAtomListProcessing,
                       (void *)0x0,"#");
      if (mabis.close != 0) {
        fclose((FILE *)mabis.inf);
      }
      autobondrot(_stderr,xdb,movingDoCommand,&mcis,deleteMovingAtom,&mabis,Verbose ^ 1);
      discardXformDB(xdb,deleteMovingAtom,&mabis);
      bins = local_970;
      ignorePat = local_978;
    }
    disposeBins(bins);
    freeDotSphere(&COdots);
    unloadDotSpheres(dots);
    freePattern(ignorePat);
    freePattern(ppVar5);
    freePattern(local_968);
    freePattern(sourcePat);
    sourcePat = (pattern *)0x0;
    freePattern(causePat);
    causePat = (pattern *)0x0;
    freePattern(extraPat);
    extraPat = (pattern *)0x0;
    if (Verbose != 0) goto LAB_001274b7;
    note("If you publish work which uses probe, please cite:");
    note("Word, et. al. (1999) J. Mol. Biol. 285, 1711-1733.");
    sprintf(message,"For more information see %s","http://kinemage.biochem.duke.edu/");
  }
  note(message);
LAB_001274b7:
  disposeListOfResidues(resLst);
  resLst = (residue *)0x0;
  disposeListOfAtoms(theAtoms);
  return 0;
}

Assistant:

int mainProbeProc(int argc, char **argv, FILE *outf)
{/*mainProbeProc()*/
   int method;
   int keepUnselected;
   region boundingBoxA;
   atom *a, *allMainAtoms = NULL;
   atomBins *abins = NULL;
   pointSet dots[NUMATOMTYPES];
   char *srcArg=NULL, *targArg=NULL, *extraArg=NULL, *ignoreArg=NULL; /* extraArg dcr 111022*/
   char *groupLabel=NULL;
   pattern *srcPat = NULL, *targPat = NULL, *ignorePat = NULL;
   float density, probeRad, spikelen;
   int drawSpike, countDots, rawOutput, sayGroup, addKinToFile, conFlag; //conFlag by SJ - 10/07/2011
   char message[200];
   movingAtomBuildInfo mabis;
   residue *resLst = NULL;
   FILE* dumpFile = NULL;

   /*mabis moving atom build info structure */
   /*buffer to pass data to newMovingAtom for autobondrot*/

   allMainAtoms = processCommandline(argc, argv, &method,
        &boundingBoxA, &density, &probeRad,
        &drawSpike, &spikelen, &countDots, &keepUnselected,
        &srcArg, &targArg, &extraArg, &ignoreArg, &groupLabel, &rawOutput, &conFlag,
        &sayGroup, &addKinToFile, &mabis, &resLst);//conFlag by SJ -10/07/2011

        /*called with address of mabis, i.e. mabip moving atom build info ptr */
        /*autobondrot mode: not read in any mobile atoms yet*/
        /*though may have static set of atoms already in. */

/* dumpRes(resLst); */

   if ((allMainAtoms == NULL) && (mabis.inf == NULL))
   {
      /*static atoms read into allMainAtoms linked list, */
      /* and/or autobondrot file name for mobile atoms held in mabis.inf */

      sprintf(message, "No atom data in input.");
      note(message);
   }
   else
   {/*there are atoms for probe to work on...*/
      if (Verbose)
      {/*Verbose: lots of stuff to screen...*/

	 note(versionString);
	 sprintf(message, "density: %g, probe radius: %g, maxBonded: %d",
			density, probeRad, Maxbonded);
	 note(message);
	 sprintf(message, "regular HB cutoff: %g, charged HB cutoff: %g",
			Min_regular_hb_cutoff, Min_charged_hb_cutoff);
	 note(message);
	 sprintf(message,
	 "Dot gap bins: low to %g, %g to 0, 0 to %g, %g to high, & Hbonds",
			LowGoodCut, LowGoodCut, HighGoodCut, HighGoodCut);
	 note(message);
	 if (RadScaleOffset < -0.0001 || RadScaleOffset > 0.0001) {
	    sprintf(message, "Add %g to VDW Rradius",
			RadScaleOffset);
	    note(message);
	 }
	 if (RadScaleFactor < 0.9999 || RadScaleFactor > 1.0001) {
	    sprintf(message, "Scale VDW Rradius by %g",
			RadScaleFactor);
	    note(message);
	 }
	 sprintf(message, "C=O carbon VDW scaled by %.3f to a radius of %g A",
			   CORadScale, CORadScale* ATOMC_EXPLICIT_VDW);
	 note(message);
	 if (rawOutput || countDots) {
	    sprintf(message, "Score Weights: gapWt=%g, bumpWt=%g, HBWt=%g",
			GAPweight, BUMPweight, HBweight);
	    note(message);
     }
	 if (drawSpike) {
	    sprintf(message, "draw spike, len: %g", spikelen);
	    note(message);
	 }
	 if (ImplicitH) {
	    note("implicit hydrogens");
	 }
	 if (PermitCHXHB) {
	    sprintf(message, "CH..O type hbonds recognized (scale factor %g)", CHOHBfactor);
	    note(message);
	 }
	 if (!DoMcMc) {
	    note("Excluding mainchain-mainchain interactions");
	 }

	 if (!DoHet && !DoH2O) {
	    note("Excluding both HET groups and waters");
	 }
	 else {
	    if (!DoHet) {
	       note("Excluding non-water HET groups");
	    }
	    if (!DoH2O) {
	       note("Excluding waters");
	    }
	    else if (!DoWatWat) {
	       note("Excluding water-water interactions");
	    }
	 }
	 if (LimitDots) {
	    note("Limiting dots from bumps to max non-bump cap");
	 }

	 if (rawOutput) { /* nothing required for raw format */
	 }
	 else if (OutputFmtType == 1) {
	    note("Formatting for display in O");
	 }
	 else if (OutputFmtType == 2) {
	    note("Formatting for display in XtalView");
	 }
	 else if (OutputFmtType == 3) { /*dcr041101*/
	    note("outputing one line colon:deliminated:counts:by:severity:type:");
	 }

	 if (ByNABaseColor) {
	    if (ColorGap) {
	       note("Coloring dots by gap (& list color by nucleic acid base)");
	    }
	    else {
	       note("Coloring dots by nucleic acid base");
	    }
	 }
	 else if (ColorGap) {
	    note("Coloring dots by gap (& list color by atom)");
	 }
	 if (!UsePolarH) {
	    note("Using old (long) radii for polar H atoms");
	 }
	 if (!OutputHBs) {
	    note("Attention: ***Output not generated for H-Bond contacts***");
	 }
	 if (!OutputClashes) {
	    note("Attention: ***Output not generated for clashes***");
	 }
	 if (!OutputVDWs) {
	    note("Attention: ***Output not generated for van der Waals contacts***");
	 }
	 if (OnlyBadOut) {
	    note("Attention: ***Output only generated for Bad Clashes***");/*dcr041010*/
     }
	 if (!keepUnselected) {
	    note("Attention: ***Unselected atoms dropped (ignored)***");
	 }
    }/*Verbose: lots of stuff to screen...*/

    /*now do some work...*/
    if(   addKinToFile  && (OutputFmtType == 0)
       && (! countDots) && (! rawOutput) ) {
       fprintf(outf, "@kinemage 1\n");
    }

    srcPat = getPat(srcArg,   "pattern 1", Verbose);
    sourcePat = getPat(srcArg,   "pattern 1", Verbose);/*111021dcr*/
    modelSrc = modelInPattern(srcPat); /*parse.c 041114*/
    if(Verbose && modelSrc > 0)
    {
       sprintf(message, "specified src  model==%d", modelSrc);
       note(message);
    }
    targPat = getPat(targArg,  "pattern 2", Verbose);
    causePat = getPat(targArg,  "pattern 2", Verbose); /*111021dcr nearest*/
    modelTarg = modelInPattern(targPat); /*parse.c 041114*/
    if(Verbose && modelSrc > 0)
    {
       sprintf(message, "specified targ model==%d", modelTarg);
       note(message);
    }
    extraPat = getPat(extraArg,"extra", Verbose); /*111023dcr*/
    ignorePat = getPat(ignoreArg,"ignore",    Verbose);

    loadDotSpheres(dots, density);

      if (allMainAtoms) /*atoms usually read in from processCommandline()*/
      {  /*build the bins for all static atoms*/
         selectSource(allMainAtoms, srcPat, SET1, targPat, SET2, ignorePat);
         abins = binAtoms(allMainAtoms, &boundingBoxA,
                          'a', probeRad, keepUnselected, SET1|SET2);
      }
      else /*but autobondrot mode may not yet have read in any atoms*/
      {/*minimal boundingBoxes setup*/
         boundingBoxA.min.x = boundingBoxA.min.y = boundingBoxA.min.z = 0.0;
         boundingBoxA.max.x = boundingBoxA.max.y = boundingBoxA.max.z = 0.1;
         abins = initBins('a', &boundingBoxA, 1); /* dummy bbox */
      }

      if (mabis.inf == NULL) /*pseudo modal flag for autobondrot*/
      {/*there is NOT an autobondrot atom info input file */
         if (! ImplicitH)
         { /*preliminary step acts on all atoms*/
            updateHydrogenInfo(outf, allMainAtoms, abins,
                               NULL, NULL, SET1|SET2, FALSE);
            /*(returned param used on separate call for autobondrot processing)*/
            /*e.g. creates: newH->elem = atomHOd , dummy Hydrogen to make an H-Bond*/
         }

    /* Dump the atom information if we've been asked to. */
    if (dumpFileName) {
      dumpFile = fopen(dumpFileName, "wb");
      for (a = allMainAtoms; a; a = a->next) {
        /* Don't dump Phantom Hydrogen information. */
        if (a->elem != atomHOd) {
          fprintf(dumpFile, "%s %s %3d %-4s %c %7.3f %7.3f %7.3f %5.2f %s %s %s\n",
            a->r->chain, a->r->resname, a->r->resid, a->atomname,
            a->altConf == ' ' ? '-' : a->altConf,
            a->loc.x, a->loc.y, a->loc.z, a->radius,
            a->props & ACCEPTOR_PROP ? "isAcceptor" : "noAcceptor",
            a->props & DONOR_PROP ? "isDonor" : "noDonor",
            a->props & METAL_PROP ? "isMetallic" : "noMetallic");
        }
      }
      fclose(dumpFile);
    }

   /*now do the real work: */
	 doCommand(outf, method,
	    allMainAtoms, abins, NULL, NULL,
	    dots, probeRad, density, spikelen,
	    countDots, rawOutput, conFlag, "", 0.0, drawSpike,
	    sayGroup, groupLabel, argc, argv, message);
      }
      else
      {/*setup to call autobondrot*/
	 xformDatabase* xdb = NULL;
	 movingCommandInfo mcis;

	 mcis.firstPass  = TRUE;
	 mcis.keepUnselected = keepUnselected;
	 mcis.outf       = outf;
	 mcis.method     = method;
	 mcis.allMainAtoms = allMainAtoms;
	 mcis.waterClones= NULL;
	 mcis.abins      = abins;
	 mcis.dots       = dots;
	 mcis.probeRad   = probeRad;
	 mcis.density    = density;
	 mcis.spikelen   = spikelen;
	 mcis.countDots  = countDots;
	 mcis.rawOutput  = rawOutput;
	 mcis.drawSpike  = drawSpike;
	 mcis.sayGroup   = sayGroup;
	 mcis.groupLabel = groupLabel;
	 mcis.argc       = argc;
	 mcis.argv       = argv;
	 mcis.message    = message;

	 mabis.srcPat    = srcPat;
	 mabis.targPat   = targPat;

#define RAW_HEADER_COMMENT "#"

        descrCommand(outf, RAW_HEADER_COMMENT, RAW_HEADER_COMMENT, argc, argv);

        /*now actually read in both the mobile atoms and transformation info*/

	xdb = readTransformationDatabase(mabis.inf, outf, newMovingAtom, &mabis,
                                       movingAtomListProcessing, NULL,
                                       RAW_HEADER_COMMENT);

/*        mabis.inf                == FILE *inf                      */
/*        outf                     == FILE *outf                     */
/*        newMovingAtom            == abrMkAtomProc mkAtom           */
/*        &mabis                   == void *atomstuff                */
/*        movingAtomListProcessing == abrAtomListProc inputListProc  */
/*        NULL                     == void *liststuff                */
/*        RAW_HEADER_COMMENT       == char *cch                      */

         /*autobondrot/readTransformationDatabase()             */
         /* also calls autobondrot/describeXformDB()            */
         /*  which writes the header-comments to the .map file! */

	 if (mabis.close) { fclose(mabis.inf); }

	 autobondrot(stderr, xdb, movingDoCommand, &mcis,
		  deleteMovingAtom, &mabis, Verbose);

         /*autobondrot.c/autobondrot() is the call to do the autobondrot stuff*/
         /*movingDoCommand is the name of the probeProc() called from there */
         /*probe.c/movingDoCommand() in turn calls probe.c/doCommand()*/

	 discardXformDB(xdb, deleteMovingAtom, &mabis);
      }/*setup to call autobondrot*/

      /*after finish, then drop through to here to release memory, etc.*/

      disposeBins(abins);         abins = NULL;
      freeDotSphere(&COdots);
      unloadDotSpheres(dots);
      freePattern(ignorePat); ignorePat = NULL;
      freePattern(targPat);     targPat = NULL;
      freePattern(srcPat);       srcPat = NULL;
      freePattern(sourcePat); sourcePat = NULL; /*111023dcr*/
      freePattern(causePat);   causePat = NULL; /*111023dcr*/
      freePattern(extraPat);   extraPat = NULL; /*111023dcr*/

      if (Verbose)
      {
	 note("If you publish work which uses probe, please cite:");
	 note(referenceString);
	 sprintf(message, "For more information see %s", electronicReference);
	 note(message);
      }
   }/*there are atoms for probe to work on...*/

   disposeListOfResidues(resLst);          resLst = NULL;
   disposeListOfAtoms(allMainAtoms); allMainAtoms = NULL;

   return 0; /*to probe.c/main() */
}